

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

void __thiscall CScriptID::CScriptID(CScriptID *this,CScript *in)

{
  long lVar1;
  long in_FS_OFFSET;
  BaseHash<uint160> *in_stack_ffffffffffffffb8;
  CScript *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Hash160<CScript>(in_stack_ffffffffffffffe8);
  BaseHash<uint160>::BaseHash(in_stack_ffffffffffffffb8,(uint160 *)0x102a4ad);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CScriptID::CScriptID(const CScript& in) : BaseHash(Hash160(in)) {}